

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O3

void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *vInfo,Gia_Man_t *pAig,Abc_Cex_t *pCex)

{
  int *piVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = pCex->nRegs;
  if (pCex->nBits != (pCex->iFrame + 1) * pCex->nPis + uVar6) {
    __assert_fail("pCex->nBits == pCex->nRegs + pCex->nPis * (pCex->iFrame + 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSeq.c"
                  ,0x31,"void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)");
  }
  iVar4 = pAig->nRegs;
  if (vInfo->nSize < (int)((pCex->nBits - uVar6) + iVar4)) {
    __assert_fail("pCex->nBits - pCex->nRegs + Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSeq.c"
                  ,0x32,"void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)");
  }
  if (vInfo->nSize < 2) {
LAB_00657f7e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar5 = (long)vInfo->pArray[1] - (long)*vInfo->pArray;
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      if (((uint)(&pCex[1].iPo)[uVar7 >> 5] >> ((uint)uVar7 & 0x1f) & 1) != 0) {
        Abc_Print(0,
                  "The CEX has flop values different from 0, but they are currently not used by \"resim\".\n"
                 );
        iVar4 = pAig->nRegs;
        break;
      }
      uVar3 = (uint)uVar7 + 1;
      uVar7 = (ulong)uVar3;
    } while (uVar6 != uVar3);
  }
  uVar6 = (uint)(uVar5 >> 2);
  if (iVar4 < 1) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      if ((long)vInfo->nSize <= (long)uVar7) goto LAB_00657f7e;
      if (0 < (int)uVar6) {
        memset(vInfo->pArray[uVar7],0,uVar5 & 0x3fffffffc);
        iVar4 = pAig->nRegs;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)iVar4);
  }
  iVar4 = pCex->nRegs;
  if (iVar4 < pCex->nBits) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      if ((long)vInfo->nSize <= (long)uVar7) goto LAB_00657f7e;
      piVar1 = (int *)vInfo->pArray[uVar7];
      if (0 < (int)uVar6) {
        uVar5 = 0;
        do {
          uVar3 = Gia_ManRandom(0);
          piVar1[uVar5] = uVar3;
          uVar5 = uVar5 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar5);
      }
      uVar7 = uVar7 + 1;
      *piVar1 = *piVar1 * 4 + ((uint)(&pCex[1].iPo)[iVar4 >> 5] >> ((byte)iVar4 & 0x1f) & 1) * 2;
      iVar4 = iVar4 + 1;
    } while (iVar4 < pCex->nBits);
  }
  iVar4 = vInfo->nSize;
  if ((int)uVar7 < iVar4) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      if (0 < (int)uVar6) {
        pvVar2 = vInfo->pArray[uVar7];
        uVar5 = 0;
        do {
          uVar3 = Gia_ManRandom(0);
          *(uint *)((long)pvVar2 + uVar5 * 4) = uVar3;
          uVar5 = uVar5 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar5);
        iVar4 = vInfo->nSize;
      }
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < iVar4);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sets register values from the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cec_ManSeqDeriveInfoFromCex( Vec_Ptr_t * vInfo, Gia_Man_t * pAig, Abc_Cex_t * pCex )
{
    unsigned * pInfo;
    int k, i, w, nWords;
    assert( pCex->nBits == pCex->nRegs + pCex->nPis * (pCex->iFrame + 1) );
    assert( pCex->nBits - pCex->nRegs + Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo) );
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
/*
    // user register values
    assert( pCex->nRegs == Gia_ManRegNum(pAig) );
    for ( k = 0; k < pCex->nRegs; k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Abc_InfoHasBit( pCex->pData, k )? ~0 : 0;
    }
*/
    // print warning about register values
    for ( k = 0; k < pCex->nRegs; k++ )
        if ( Abc_InfoHasBit( pCex->pData, k ) )
            break;
    if ( k < pCex->nRegs )
        Abc_Print( 0, "The CEX has flop values different from 0, but they are currently not used by \"resim\".\n" );

    // assign zero register values
    for ( k = 0; k < Gia_ManRegNum(pAig); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k++ );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom(0);
        // set simulation pattern and make sure it is second (first will be erased during simulation)
        pInfo[0] = (pInfo[0] << 1) | Abc_InfoHasBit( pCex->pData, i ); 
        pInfo[0] <<= 1;
    }
    for ( ; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom(0);
    }
}